

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,cmDuration timeout,Encoding encoding)

{
  StdioConfiguration SVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  cmUVProcessChainBuilder *pcVar6;
  uv_loop_t *puVar7;
  ulong uVar8;
  Status *this;
  ostream *poVar9;
  bool bVar10;
  bool timedOut;
  cmProcessOutput processOutput;
  bool errFinished;
  bool outFinished;
  OutputOption outputflag_local;
  cmUVProcessChain chain;
  StdioType local_1d0;
  int iStack_1cc;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> errorHandle;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  uv_timer_ptr timer;
  anon_class_24_3_3cd7b453 startRead;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<char,_std::allocator<char>_> tempStdOut;
  uv_pipe_ptr errStream;
  uv_pipe_ptr outStream;
  string local_f0;
  string local_d0;
  string local_b0;
  cmUVProcessChainBuilder builder;
  
  outputflag_local = outputflag;
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
  pcVar6 = cmUVProcessChainBuilder::SetExternalStream(&builder,Stream_INPUT,_stdin);
  cmUVProcessChainBuilder::AddCommand(pcVar6,command);
  if (dir != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,dir,(allocator<char> *)&startRead);
    cmUVProcessChainBuilder::SetWorkingDirectory(&builder,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if (outputflag_local == OUTPUT_MERGE) {
LAB_0019cd93:
    cmUVProcessChainBuilder::SetMergedBuiltinStreams(&builder);
  }
  else {
    if (outputflag_local != OUTPUT_PASSTHROUGH) {
      bVar10 = captureStdErr != (string *)0x0;
      if (captureStdErr != captureStdOut || captureStdErr == (string *)0x0) {
        pcVar6 = cmUVProcessChainBuilder::SetBuiltinStream(&builder,Stream_OUTPUT);
        cmUVProcessChainBuilder::SetBuiltinStream(pcVar6,Stream_ERROR);
        goto LAB_0019cda5;
      }
      goto LAB_0019cd93;
    }
    pcVar6 = cmUVProcessChainBuilder::SetExternalStream(&builder,Stream_OUTPUT,_stdout);
    cmUVProcessChainBuilder::SetExternalStream(pcVar6,Stream_ERROR,_stderr);
    captureStdOut = (string *)0x0;
  }
  bVar10 = false;
  captureStdErr = (string *)0x0;
LAB_0019cda5:
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&chain);
  timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
  super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
  super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((timeout.__r != 0.0) || (NAN(timeout.__r))) {
    puVar7 = cmUVProcessChain::GetLoop(&chain);
    ::cm::uv_timer_ptr::init(&timer,(EVP_PKEY_CTX *)puVar7);
    uVar8 = (ulong)(timeout.__r * 1000.0);
    ::cm::uv_timer_ptr::start
              (&timer,RunSingleCommand::anon_class_1_0_00000001::__invoke,
               (long)(timeout.__r * 1000.0 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8,0)
    ;
  }
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  outStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  outStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  errStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  errStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  outputHandle._M_t.
  super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t.
  super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
  super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
       )(__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)0x0;
  errorHandle._M_t.
  super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t.
  super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
  super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
       )(__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)0x0;
  if ((outputflag_local != OUTPUT_PASSTHROUGH) &&
     ((bool)(captureStdOut != (string *)0x0 | bVar10 | outputflag_local != OUTPUT_NONE))) {
    startRead.outputflag = &outputflag_local;
    startRead.processOutput = &processOutput;
    startRead.chain = &chain;
    uVar3 = cmUVProcessChain::OutputStream(&chain);
    RunSingleCommand::anon_class_24_3_3cd7b453::operator()
              ((anon_class_24_3_3cd7b453 *)&stack0xfffffffffffffe30,(uv_pipe_ptr *)&startRead,
               (int)&outStream,(string *)(ulong)uVar3,
               (vector<char,_std::allocator<char>_> *)captureStdOut,(int)&tempStdOut,
               (_func_void_string_ptr *)0x1,(bool *)Stdout);
    SVar1 = _local_1d0;
    local_1d0 = None;
    iStack_1cc = 0;
    std::__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::reset
              ((__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
               &outputHandle,(pointer)SVar1);
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
               &stack0xfffffffffffffe30);
    iVar4 = cmUVProcessChain::OutputStream(&chain);
    iVar5 = cmUVProcessChain::ErrorStream(&chain);
    if (iVar4 != iVar5) {
      uVar3 = cmUVProcessChain::ErrorStream(&chain);
      RunSingleCommand::anon_class_24_3_3cd7b453::operator()
                ((anon_class_24_3_3cd7b453 *)&stack0xfffffffffffffe30,(uv_pipe_ptr *)&startRead,
                 (int)&errStream,(string *)(ulong)uVar3,
                 (vector<char,_std::allocator<char>_> *)captureStdErr,(int)&tempStdErr,
                 (_func_void_string_ptr *)0x2,(bool *)Stderr);
      SVar1 = _local_1d0;
      local_1d0 = None;
      iStack_1cc = 0;
      std::__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::reset
                ((__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                  *)&errorHandle,(pointer)SVar1);
      std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
                ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                 &stack0xfffffffffffffe30);
    }
  }
  while (bVar2 = cmUVProcessChain::Finished(&chain), !bVar2) {
    puVar7 = cmUVProcessChain::GetLoop(&chain);
    uv_run(puVar7,UV_RUN_ONCE);
  }
  if (captureStdOut != (string *)0x0) {
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)captureStdOut,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__cxx11::string::string((string *)&local_d0,(string *)captureStdOut);
    cmProcessOutput::DecodeText(&processOutput,&local_d0,captureStdOut,0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if (bVar10) {
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)captureStdErr,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__cxx11::string::string((string *)&local_f0,(string *)captureStdErr);
    cmProcessOutput::DecodeText(&processOutput,&local_f0,captureStdErr,0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  this = cmUVProcessChain::GetStatus(&chain,0);
  cmUVProcessChain::Status::GetException_abi_cxx11_
            ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&startRead,this);
  if ((int)startRead.outputflag == 0) {
    if (retVal == (int *)0x0) {
      bVar10 = this->ExitStatus == 0;
    }
    else {
      *retVal = (int)this->ExitStatus;
      bVar10 = true;
    }
  }
  else {
    if (outputflag_local != OUTPUT_NONE) {
      poVar9 = std::operator<<((ostream *)&std::cerr,(string *)&startRead.processOutput);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    if (!(bool)(~bVar10 & captureStdOut == (string *)0x0)) {
      if (bVar10) {
        captureStdOut = captureStdErr;
      }
      std::__cxx11::string::append((string *)captureStdOut);
    }
    bVar10 = false;
  }
  std::__cxx11::string::~string((string *)&startRead.processOutput);
  std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
            (&errorHandle);
  std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
            (&outputHandle);
  ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_pipe_s> *)&errStream);
  ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_pipe_s> *)&outStream);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempStdErr.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempStdOut.super__Vector_base<char,_std::allocator<char>_>);
  ::cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_timer_s> *)&timer);
  cmUVProcessChain::~cmUVProcessChain(&chain);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&builder);
  return bVar10;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string> const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr, int* retVal,
                                     const char* dir, OutputOption outputflag,
                                     cmDuration timeout, Encoding encoding)
{
  cmUVProcessChainBuilder builder;
  builder.SetExternalStream(cmUVProcessChainBuilder::Stream_INPUT, stdin)
    .AddCommand(command);
  if (dir) {
    builder.SetWorkingDirectory(dir);
  }

  if (outputflag == OUTPUT_PASSTHROUGH) {
    captureStdOut = nullptr;
    captureStdErr = nullptr;
    builder.SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
      .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);
  } else if (outputflag == OUTPUT_MERGE ||
             (captureStdErr && captureStdErr == captureStdOut)) {
    builder.SetMergedBuiltinStreams();
    captureStdErr = nullptr;
  } else {
    builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
      .SetBuiltinStream(cmUVProcessChainBuilder::Stream_ERROR);
  }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  auto chain = builder.Start();
  bool timedOut = false;
  cm::uv_timer_ptr timer;
  if (timeout.count()) {
    timer.init(chain.GetLoop(), &timedOut);
    timer.start(
      [](uv_timer_t* t) {
        auto* timedOutPtr = static_cast<bool*>(t->data);
        *timedOutPtr = true;
      },
      static_cast<uint64_t>(timeout.count() * 1000.0), 0);
  }

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  cm::uv_pipe_ptr outStream;
  bool outFinished = true;
  cm::uv_pipe_ptr errStream;
  bool errFinished = true;
  cmProcessOutput processOutput(encoding);
  std::unique_ptr<cmUVStreamReadHandle> outputHandle;
  std::unique_ptr<cmUVStreamReadHandle> errorHandle;
  if (outputflag != OUTPUT_PASSTHROUGH &&
      (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)) {
    auto startRead =
      [&outputflag, &processOutput,
       &chain](cm::uv_pipe_ptr& pipe, int stream, std::string* captureStd,
               std::vector<char>& tempStd, int id,
               void (*outputFunc)(const std::string&),
               bool& finished) -> std::unique_ptr<cmUVStreamReadHandle> {
      if (stream < 0) {
        return nullptr;
      }

      pipe.init(chain.GetLoop(), 0);
      uv_pipe_open(pipe, stream);

      finished = false;
      return cmUVStreamRead(
        pipe,
        [outputflag, &processOutput, captureStd, &tempStd, id,
         outputFunc](std::vector<char> data) {
          // Translate NULL characters in the output into valid text.
          for (auto& c : data) {
            if (c == '\0') {
              c = ' ';
            }
          }

          if (outputflag != OUTPUT_NONE) {
            std::string strdata;
            processOutput.DecodeText(data.data(), data.size(), strdata, id);
            outputFunc(strdata);
          }
          if (captureStd) {
            cm::append(tempStd, data.data(), data.data() + data.size());
          }
        },
        [&finished, outputflag, &processOutput, id, outputFunc]() {
          finished = true;
          if (outputflag != OUTPUT_NONE) {
            std::string strdata;
            processOutput.DecodeText(std::string(), strdata, id);
            if (!strdata.empty()) {
              outputFunc(strdata);
            }
          }
        });
    };

    outputHandle =
      startRead(outStream, chain.OutputStream(), captureStdOut, tempStdOut, 1,
                cmSystemTools::Stdout, outFinished);
    if (chain.OutputStream() != chain.ErrorStream()) {
      errorHandle =
        startRead(errStream, chain.ErrorStream(), captureStdErr, tempStdErr, 2,
                  cmSystemTools::Stderr, errFinished);
    }
  }

  while (!timedOut && !(chain.Finished() && outFinished && errFinished)) {
    uv_run(&chain.GetLoop(), UV_RUN_ONCE);
  }

  if (captureStdOut) {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    processOutput.DecodeText(*captureStdOut, *captureStdOut);
  }
  if (captureStdErr) {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    processOutput.DecodeText(*captureStdErr, *captureStdErr);
  }

  bool result = true;
  if (timedOut) {
    const char* error_str = "Process terminated due to timeout\n";
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  } else {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();

    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        if (retVal) {
          *retVal = static_cast<int>(status.ExitStatus);
        } else {
          if (status.ExitStatus != 0) {
            result = false;
          }
        }
        break;
      default: {
        if (outputflag != OUTPUT_NONE) {
          std::cerr << exception.second << std::endl;
        }
        if (captureStdErr) {
          captureStdErr->append(exception.second);
        } else if (captureStdOut) {
          captureStdOut->append(exception.second);
        }
        result = false;
      } break;
    }
  }

  return result;
}